

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_>::InitializePage
          (ModeState<duckdb::interval_t,_duckdb::ModeStandard<duckdb::interval_t>_> *this,
          WindowPartitionInput *partition)

{
  ColumnDataCollection *this_00;
  ColumnDataScanState *pCVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  if (this->scan == (ColumnDataScanState *)0x0) {
    pCVar1 = (ColumnDataScanState *)operator_new(0x80);
    (pCVar1->current_chunk_state).handles._M_h._M_buckets = (__buckets_ptr)0x0;
    (pCVar1->current_chunk_state).handles._M_h._M_bucket_count = 0;
    *(undefined8 *)&(pCVar1->current_chunk_state).handles._M_h._M_rehash_policy = 0;
    (pCVar1->current_chunk_state).handles._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar1->current_chunk_state).handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)&(pCVar1->current_chunk_state).properties = 0;
    *(undefined8 *)&pCVar1->properties = 0;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pCVar1->current_chunk_state).handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (pCVar1->current_chunk_state).handles._M_h._M_element_count = 0;
    pCVar1->segment_index = 0;
    pCVar1->chunk_index = 0;
    pCVar1->current_row_index = 0;
    pCVar1->next_row_index = 0;
    (pCVar1->current_chunk_state).handles._M_h._M_buckets =
         &(pCVar1->current_chunk_state).handles._M_h._M_single_bucket;
    (pCVar1->current_chunk_state).handles._M_h._M_bucket_count = 1;
    (pCVar1->current_chunk_state).handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (pCVar1->current_chunk_state).handles._M_h._M_rehash_policy._M_next_resize = 0;
    (pCVar1->current_chunk_state).handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (pCVar1->current_chunk_state).properties = INVALID;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pCVar1->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->scan = pCVar1;
  }
  if ((this->page).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->page).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = partition->inputs;
    this->inputs = this_00;
    pCVar1 = this->scan;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_40,
               &(partition->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    ColumnDataCollection::InitializeScan
              (this_00,pCVar1,(vector<unsigned_long,_true> *)&local_40,ALLOW_ZERO_COPY);
    if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    ColumnDataCollection::InitializeScanChunk(this->inputs,this->scan,&this->page);
  }
  return;
}

Assistant:

void InitializePage(const WindowPartitionInput &partition) {
		if (!scan) {
			scan = new ColumnDataScanState();
		}
		if (page.ColumnCount() == 0) {
			D_ASSERT(partition.inputs);
			inputs = partition.inputs;
			D_ASSERT(partition.column_ids.size() == 1);
			inputs->InitializeScan(*scan, partition.column_ids);
			inputs->InitializeScanChunk(*scan, page);
		}
	}